

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLLibraryEffectsLoader14.cpp
# Opt level: O0

bool __thiscall
COLLADASaxFWL::LibraryEffectsLoader14::begin__init_from____fx_surface_init_from_common
          (LibraryEffectsLoader14 *this,
          init_from____fx_surface_init_from_common__AttributeData *attributeData)

{
  byte bVar1;
  undefined4 *in_RSI;
  long in_RDI;
  init_from____fx_surface_init_from_common__AttributeData attrData;
  undefined4 local_1c;
  undefined4 local_18;
  undefined4 local_14;
  
  local_1c = *in_RSI;
  local_18 = in_RSI[1];
  switch(in_RSI[2]) {
  case 0:
    local_14 = 0;
    break;
  case 1:
    local_14 = 1;
    break;
  case 2:
    local_14 = 2;
    break;
  case 3:
    local_14 = 3;
    break;
  case 4:
    local_14 = 4;
    break;
  case 5:
    local_14 = 5;
    break;
  case 6:
    local_14 = 6;
    break;
  case 7:
    local_14 = 7;
  }
  bVar1 = (**(code **)(**(long **)(in_RDI + 0x20) + 0x110))(*(long **)(in_RDI + 0x20),&local_1c);
  return (bool)(bVar1 & 1);
}

Assistant:

bool LibraryEffectsLoader14::begin__init_from____fx_surface_init_from_common( const COLLADASaxFWL14::init_from____fx_surface_init_from_common__AttributeData& attributeData )
{
SaxVirtualFunctionTest14(begin__init_from____fx_surface_init_from_common(attributeData));
COLLADASaxFWL::init_from____fx_surface_init_from_common__AttributeData attrData;
attrData.mip = attributeData.mip;
attrData.slice = attributeData.slice;
switch (attributeData.face) {
case COLLADASaxFWL14::ENUM__fx_surface_face_enum__POSITIVE_X: attrData.face=COLLADASaxFWL::ENUM__fx_surface_face__POSITIVE_X; break;
case COLLADASaxFWL14::ENUM__fx_surface_face_enum__NEGATIVE_X: attrData.face=COLLADASaxFWL::ENUM__fx_surface_face__NEGATIVE_X; break;
case COLLADASaxFWL14::ENUM__fx_surface_face_enum__POSITIVE_Y: attrData.face=COLLADASaxFWL::ENUM__fx_surface_face__POSITIVE_Y; break;
case COLLADASaxFWL14::ENUM__fx_surface_face_enum__NEGATIVE_Y: attrData.face=COLLADASaxFWL::ENUM__fx_surface_face__NEGATIVE_Y; break;
case COLLADASaxFWL14::ENUM__fx_surface_face_enum__POSITIVE_Z: attrData.face=COLLADASaxFWL::ENUM__fx_surface_face__POSITIVE_Z; break;
case COLLADASaxFWL14::ENUM__fx_surface_face_enum__NEGATIVE_Z: attrData.face=COLLADASaxFWL::ENUM__fx_surface_face__NEGATIVE_Z; break;
case COLLADASaxFWL14::ENUM__fx_surface_face_enum__COUNT: attrData.face=COLLADASaxFWL::ENUM__fx_surface_face__INVALID; break;
case COLLADASaxFWL14::ENUM__fx_surface_face_enum__NOT_PRESENT: attrData.face=COLLADASaxFWL::ENUM__fx_surface_face__NOT_PRESENT; break;
}
return mLoader->begin__init_from____fx_surface_init_from_common(attrData);
}